

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O2

void Abc_FrameDeallocate(Abc_Frame_t *p)

{
  void *pvVar1;
  int i;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int i_1;
  long lVar4;
  
  Rwt_ManGlobalStop();
  if (p->vAbcObjIds != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vAbcObjIds);
  }
  pVVar3 = p->vCexVec;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    for (iVar2 = 0; iVar2 < pVVar3->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(pVVar3,iVar2);
      if ((void *)0x2 < pvVar1) {
        free(pvVar1);
      }
    }
    Vec_PtrFree(pVVar3);
  }
  pVVar3 = p->vPoEquivs;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    for (lVar4 = 0; lVar4 < pVVar3->nSize; lVar4 = lVar4 + 1) {
      if ((Vec_Ptr_t *)pVVar3->pArray[lVar4] != (Vec_Ptr_t *)0x0) {
        Vec_PtrFree((Vec_Ptr_t *)pVVar3->pArray[lVar4]);
      }
    }
    Vec_PtrFree(pVVar3);
  }
  if (p->vStatuses != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vStatuses);
  }
  if ((Dec_Man_t *)p->pManDec != (Dec_Man_t *)0x0) {
    Dec_ManStop((Dec_Man_t *)p->pManDec);
  }
  if (p->dd != (DdManager *)0x0) {
    Extra_StopManager(p->dd);
  }
  if (p->vStore != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vStore);
  }
  if ((Aig_Man_t *)p->pSave1 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave1);
  }
  if ((Aig_Man_t *)p->pSave2 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave2);
  }
  if ((Aig_Man_t *)p->pSave3 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave3);
  }
  if ((Aig_Man_t *)p->pSave4 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave4);
  }
  if ((If_DsdMan_t *)p->pManDsd != (If_DsdMan_t *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd,0);
  }
  if ((If_DsdMan_t *)p->pManDsd2 != (If_DsdMan_t *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd2,0);
  }
  if (p->pNtkBackup != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(p->pNtkBackup);
  }
  pVVar3 = p->vPlugInComBinPairs;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    for (iVar2 = 0; iVar2 < pVVar3->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(pVVar3,iVar2);
      free(pvVar1);
      pVVar3 = p->vPlugInComBinPairs;
    }
    Vec_PtrFree(pVVar3);
  }
  Vec_IntFreeP(&p->vIndFlops);
  pVVar3 = p->vLTLProperties_global;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      p->vLTLProperties_global->pArray = (void **)0x0;
      pVVar3 = p->vLTLProperties_global;
      if (pVVar3 == (Vec_Ptr_t *)0x0) goto LAB_002b8f34;
    }
    free(pVVar3);
    p->vLTLProperties_global = (Vec_Ptr_t *)0x0;
  }
LAB_002b8f34:
  Abc_FrameDeleteAllNetworks(p);
  if (p->pDrivingCell != (char *)0x0) {
    free(p->pDrivingCell);
    p->pDrivingCell = (char *)0x0;
  }
  if (p->pCex2 != (Abc_Cex_t *)0x0) {
    free(p->pCex2);
    p->pCex2 = (Abc_Cex_t *)0x0;
  }
  if (p->pCex != (Abc_Cex_t *)0x0) {
    free(p->pCex);
    p->pCex = (Abc_Cex_t *)0x0;
  }
  Vec_IntFreeP(&p->pAbcWlcInv);
  Vec_IntFreeP(&p->pAbcWlcCnf);
  Vec_StrFreeP(&p->pAbcWlcStr);
  free(p);
  s_GlobalFrame = (Abc_Frame_t *)0x0;
  return;
}

Assistant:

void Abc_FrameDeallocate( Abc_Frame_t * p )
{
    extern void Rwt_ManGlobalStop();
    extern void undefine_cube_size();
//    extern void Ivy_TruthManStop();
//    Abc_HManStop();
//    undefine_cube_size();
    Rwt_ManGlobalStop();
//    Ivy_TruthManStop();
    if ( p->vAbcObjIds)  Vec_IntFree( p->vAbcObjIds );
    if ( p->vCexVec   )  Vec_PtrFreeFree( p->vCexVec );
    if ( p->vPoEquivs )  Vec_VecFree( (Vec_Vec_t *)p->vPoEquivs );
    if ( p->vStatuses )  Vec_IntFree( p->vStatuses );
    if ( p->pManDec   )  Dec_ManStop( (Dec_Man_t *)p->pManDec );
#ifdef ABC_USE_CUDD
    if ( p->dd        )  Extra_StopManager( p->dd );
#endif
    if ( p->vStore    )  Vec_PtrFree( p->vStore );
    if ( p->pSave1    )  Aig_ManStop( (Aig_Man_t *)p->pSave1 );
    if ( p->pSave2    )  Aig_ManStop( (Aig_Man_t *)p->pSave2 );
    if ( p->pSave3    )  Aig_ManStop( (Aig_Man_t *)p->pSave3 );
    if ( p->pSave4    )  Aig_ManStop( (Aig_Man_t *)p->pSave4 );
    if ( p->pManDsd   )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd, 0 );
    if ( p->pManDsd2  )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd2, 0 );
    if ( p->pNtkBackup)  Abc_NtkDelete( p->pNtkBackup );
    if ( p->vPlugInComBinPairs ) 
    {
        char * pTemp;
        int i;
        Vec_PtrForEachEntry( char *, p->vPlugInComBinPairs, pTemp, i )
            ABC_FREE( pTemp );
        Vec_PtrFree( p->vPlugInComBinPairs );
    }
    Vec_IntFreeP( &p->vIndFlops );
    Vec_PtrFreeP( &p->vLTLProperties_global );
    Abc_FrameDeleteAllNetworks( p );
    ABC_FREE( p->pDrivingCell );
    ABC_FREE( p->pCex2 );
    ABC_FREE( p->pCex );
    Vec_IntFreeP( &p->pAbcWlcInv );
    Vec_IntFreeP( &p->pAbcWlcCnf );
    Vec_StrFreeP( &p->pAbcWlcStr );
    ABC_FREE( p );
    s_GlobalFrame = NULL;
}